

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zetDebugAttach
          (zet_device_handle_t hDevice,zet_debug_config_t *config,
          zet_debug_session_handle_t *phDebug)

{
  ze_result_t zVar1;
  
  if (DAT_0010e8f8 != (code *)0x0) {
    zVar1 = (*DAT_0010e8f8)();
    return zVar1;
  }
  context_t::get()::count = (zet_debug_session_handle_t)((long)context_t::get()::count + 1);
  *phDebug = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugAttach(
        zet_device_handle_t hDevice,                    ///< [in] device handle
        const zet_debug_config_t* config,               ///< [in] the debug configuration
        zet_debug_session_handle_t* phDebug             ///< [out] debug session handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAttach = context.zetDdiTable.Debug.pfnAttach;
        if( nullptr != pfnAttach )
        {
            result = pfnAttach( hDevice, config, phDebug );
        }
        else
        {
            // generic implementation
            *phDebug = reinterpret_cast<zet_debug_session_handle_t>( context.get() );

        }

        return result;
    }